

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeAtomTypesSectionParser.cpp
# Opt level: O3

void __thiscall
OpenMD::ChargeAtomTypesSectionParser::parseLine
          (ChargeAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  AtomType *pAVar3;
  RealType RVar4;
  string atomTypeName;
  FixedChargeAdapter fca;
  StringTokenizer tokenizer;
  string local_b0;
  double local_90;
  FixedChargeAdapter local_88;
  StringTokenizer local_80;
  
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_80,line,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  iVar2 = StringTokenizer::countTokens(&local_80);
  if (iVar2 < 2) {
    snprintf(painCave.errMsg,2000,
             "ChargeAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    local_90 = (this->options_->ChargeUnitScaling).data_;
    StringTokenizer::nextToken_abi_cxx11_(&local_b0,&local_80);
    pAVar3 = ForceField::getAtomType(ff,&local_b0);
    if (pAVar3 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "ChargeAtomTypesSectionParser Error: Can not find matching AtomType at line %d\n",
               (ulong)(uint)lineNo);
      painCave.isFatal = 1;
      simError();
    }
    else {
      local_88.at_ = pAVar3;
      RVar4 = StringTokenizer::nextTokenAsDouble(&local_80);
      FixedChargeAdapter::makeFixedCharge(&local_88,local_90 * RVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.delim_._M_dataplus._M_p != &local_80.delim_.field_2) {
    operator_delete(local_80.delim_._M_dataplus._M_p,
                    local_80.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.tokenString_._M_dataplus._M_p != &local_80.tokenString_.field_2) {
    operator_delete(local_80.tokenString_._M_dataplus._M_p,
                    local_80.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ChargeAtomTypesSectionParser::parseLine(ForceField& ff,
                                               const std::string& line,
                                               int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    if (nTokens < 2) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "ChargeAtomTypesSectionParser Error: Not enough tokens at line %d\n",
          lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      RealType cus_ = options_.getChargeUnitScaling();

      std::string atomTypeName = tokenizer.nextToken();

      AtomType* atomType = ff.getAtomType(atomTypeName);
      if (atomType != NULL) {
        FixedChargeAdapter fca = FixedChargeAdapter(atomType);
        RealType charge        = cus_ * tokenizer.nextTokenAsDouble();
        fca.makeFixedCharge(charge);
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ChargeAtomTypesSectionParser Error: Can not find matching "
                 "AtomType at "
                 "line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      }
    }
  }